

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_hosts_file.c
# Opt level: O1

ares_status_t ares_hosts_update(ares_channel_t *channel,ares_bool_t use_env)

{
  bool bVar1;
  ares_channel_t *paVar2;
  int iVar3;
  ares_bool_t aVar4;
  ares_status_t aVar5;
  undefined4 uVar6;
  char *pcVar7;
  time_t tVar8;
  ares_buf_t *buf;
  ares_hosts_file_t *paVar9;
  char *pcVar10;
  ares_htable_strvp_t *paVar11;
  size_t sVar12;
  ares_llist_t *paVar13;
  ares_llist_node_t *paVar14;
  ares_hosts_entry_t *paVar15;
  void *pvVar16;
  size_t out_len;
  ares_status_t aVar17;
  long lVar18;
  char cVar19;
  stat st;
  ares_hosts_entry_t *local_160;
  uchar local_152;
  uchar local_151;
  ares_hosts_file_t *local_150;
  size_t local_148;
  ares_channel_t *local_140;
  stat local_138;
  
  if (channel->hosts_path == (char *)0x0) {
    pcVar7 = (char *)0x0;
LAB_001113cf:
    if (use_env != ARES_FALSE) {
      if (pcVar7 != (char *)0x0) {
        ares_free(pcVar7);
      }
      pcVar7 = getenv("CARES_HOSTS");
      pcVar7 = ares_strdup(pcVar7);
      if (pcVar7 == (char *)0x0) goto LAB_00111421;
    }
    aVar17 = ARES_SUCCESS;
    if (pcVar7 == (char *)0x0) {
      pcVar7 = ares_strdup("/etc/hosts");
      aVar17 = ARES_ENOMEM;
      if (pcVar7 != (char *)0x0) {
        aVar17 = ARES_SUCCESS;
      }
    }
  }
  else {
    pcVar7 = ares_strdup(channel->hosts_path);
    if (pcVar7 != (char *)0x0) goto LAB_001113cf;
LAB_00111421:
    aVar17 = ARES_ENOMEM;
    pcVar7 = (char *)0x0;
  }
  if (aVar17 != ARES_SUCCESS) {
    return aVar17;
  }
  paVar9 = channel->hf;
  iVar3 = stat(pcVar7,&local_138);
  if (paVar9 != (ares_hosts_file_t *)0x0) {
    if (iVar3 != 0) {
      local_138.st_mtim.tv_sec = 0;
    }
    if (local_138.st_mtim.tv_sec == 0) {
      tVar8 = time((time_t *)0x0);
      local_138.st_mtim.tv_sec = tVar8 + -0x3c;
    }
    aVar4 = ares_strcaseeq(paVar9->filename,pcVar7);
    if ((aVar4 != ARES_FALSE) && (aVar17 = ARES_SUCCESS, local_138.st_mtim.tv_sec < paVar9->ts))
    goto LAB_001114ec;
  }
  ares_hosts_file_destroy(channel->hf);
  channel->hf = (ares_hosts_file_t *)0x0;
  buf = ares_buf_create();
  aVar17 = ARES_ENOMEM;
  if ((buf != (ares_buf_t *)0x0) &&
     (aVar17 = ares_buf_load_file(pcVar7,buf), aVar17 == ARES_SUCCESS)) {
    paVar9 = (ares_hosts_file_t *)ares_malloc_zero(0x20);
    if (paVar9 == (ares_hosts_file_t *)0x0) {
LAB_0011155b:
      ares_hosts_file_destroy(paVar9);
      paVar9 = (ares_hosts_file_t *)0x0;
    }
    else {
      tVar8 = time((time_t *)0x0);
      paVar9->ts = tVar8;
      pcVar10 = ares_strdup(pcVar7);
      paVar9->filename = pcVar10;
      if (pcVar10 == (char *)0x0) goto LAB_0011155b;
      paVar11 = ares_htable_strvp_create(ares_hosts_entry_destroy_cb);
      paVar9->iphash = paVar11;
      if (paVar11 == (ares_htable_strvp_t *)0x0) goto LAB_0011155b;
      paVar11 = ares_htable_strvp_create((ares_htable_strvp_val_free_t)0x0);
      paVar9->hosthash = paVar11;
      if (paVar11 == (ares_htable_strvp_t *)0x0) goto LAB_0011155b;
    }
    aVar17 = ARES_ENOMEM;
    if (paVar9 != (ares_hosts_file_t *)0x0) {
      sVar12 = ares_buf_len(buf);
      aVar17 = ARES_SUCCESS;
      if (sVar12 != 0) {
        local_160 = (ares_hosts_entry_t *)0x0;
        local_150 = paVar9;
LAB_00111592:
        local_152 = '#';
        ares_buf_consume_whitespace(buf,ARES_FALSE);
        sVar12 = ares_buf_len(buf);
        if (sVar12 == 0) {
          uVar6 = 4;
        }
        else {
          aVar4 = ares_buf_begins_with(buf,&local_152,1);
          local_148 = CONCAT44(local_148._4_4_,3);
          aVar5 = aVar17;
          if (aVar4 != ARES_FALSE) goto LAB_001115cf;
          ares_buf_tag(buf);
          ares_buf_consume_nonwhitespace(buf);
          aVar17 = ares_buf_tag_fetch_string(buf,(char *)&local_138,0x2e);
          if (aVar17 == ARES_SUCCESS) {
            aVar4 = ares_normalize_ipaddr((char *)&local_138,(char *)&local_138,out_len);
            if (aVar4 == ARES_FALSE) {
              aVar17 = ARES_EBADSTR;
              goto LAB_00111622;
            }
            local_160 = (ares_hosts_entry_t *)ares_malloc_zero(0x18);
            aVar17 = ARES_ENOMEM;
            if (local_160 == (ares_hosts_entry_t *)0x0) goto LAB_00111622;
            paVar13 = ares_llist_create(ares_free);
            local_160->ips = paVar13;
            if ((paVar13 == (ares_llist_t *)0x0) ||
               (pcVar10 = ares_strdup((char *)&local_138), pcVar10 == (char *)0x0)) {
LAB_00111bac:
              ares_hosts_entry_destroy(local_160);
              goto LAB_00111622;
            }
            paVar14 = ares_llist_insert_first(local_160->ips,pcVar10);
            if (paVar14 == (ares_llist_node_t *)0x0) {
              ares_free(pcVar10);
              goto LAB_00111bac;
            }
            aVar17 = ARES_SUCCESS;
          }
          else {
LAB_00111622:
            local_160 = (ares_hosts_entry_t *)0x0;
          }
          if (aVar17 == ARES_ENOMEM) {
LAB_001118ab:
            uVar6 = 2;
            goto LAB_001118ae;
          }
          aVar5 = aVar17;
          if (aVar17 == ARES_SUCCESS) {
            paVar13 = ares_llist_create(ares_free);
            local_160->hosts = paVar13;
            if (paVar13 == (ares_llist_t *)0x0) {
              aVar17 = ARES_ENOMEM;
            }
            else {
              sVar12 = ares_buf_len(buf);
              while (sVar12 != 0) {
                local_151 = '#';
                ares_buf_consume_whitespace(buf,ARES_FALSE);
                sVar12 = ares_buf_len(buf);
                lVar18 = 3;
                if ((sVar12 == 0) ||
                   (aVar4 = ares_buf_begins_with(buf,&local_151,1), aVar4 != ARES_FALSE))
                goto LAB_001116a4;
                ares_buf_tag(buf);
                sVar12 = ares_buf_consume_nonwhitespace(buf);
                if (sVar12 == 0) goto LAB_001116a4;
                aVar5 = ares_buf_tag_fetch_string(buf,(char *)&local_138,0x100);
                if (aVar5 == ARES_SUCCESS) {
                  aVar4 = ares_is_hostname((char *)&local_138);
                  lVar18 = 2;
                  if (aVar4 == ARES_FALSE) goto LAB_001116a4;
                  paVar14 = ares_llist_node_first(local_160->ips);
                  goto joined_r0x00111751;
                }
                sVar12 = ares_llist_len(local_160->hosts);
                if (sVar12 == 0) {
                  aVar17 = ARES_EBADSTR;
                }
                switch(sVar12 != 0) {
                case false:
                  goto switchD_00111728_caseD_0;
                case true:
                  sVar12 = ares_buf_len(buf);
                }
              }
              sVar12 = ares_llist_len(local_160->hosts);
              aVar17 = ARES_SUCCESS;
              if (sVar12 == 0) {
                aVar17 = ARES_EBADSTR;
              }
switchD_00111728_caseD_0:
              paVar9 = local_150;
            }
            if (aVar17 == ARES_SUCCESS) {
              local_148 = ares_llist_len(local_160->hosts);
              paVar14 = ares_llist_node_first(local_160->ips);
              if (paVar14 == (ares_llist_node_t *)0x0) {
                paVar15 = (ares_hosts_entry_t *)0x0;
              }
              else {
                do {
                  pcVar10 = (char *)ares_llist_node_val(paVar14);
                  paVar15 = (ares_hosts_entry_t *)
                            ares_htable_strvp_get_direct(local_150->iphash,pcVar10);
                  if (paVar15 != (ares_hosts_entry_t *)0x0) {
                    iVar3 = 1;
                    goto LAB_001119b8;
                  }
                  paVar14 = ares_llist_node_next(paVar14);
                } while (paVar14 != (ares_llist_node_t *)0x0);
              }
              for (paVar14 = ares_llist_node_first(local_160->hosts);
                  paVar14 != (ares_llist_node_t *)0x0; paVar14 = ares_llist_node_next(paVar14)) {
                pcVar10 = (char *)ares_llist_node_val(paVar14);
                paVar15 = (ares_hosts_entry_t *)
                          ares_htable_strvp_get_direct(local_150->hosthash,pcVar10);
                if (paVar15 != (ares_hosts_entry_t *)0x0) {
                  iVar3 = 2;
                  goto LAB_001119b8;
                }
              }
              iVar3 = 0;
LAB_001119b8:
              if (iVar3 != 0) {
                if (iVar3 != 1) {
                  paVar14 = ares_llist_node_first(local_160->ips);
                  while (paVar14 != (ares_llist_node_t *)0x0) {
                    pcVar10 = (char *)ares_llist_node_val(paVar14);
                    pvVar16 = ares_htable_strvp_get_direct(local_150->iphash,pcVar10);
                    if (pvVar16 == (void *)0x0) {
                      ares_llist_node_mvparent_last(paVar14,paVar15->ips);
                    }
                    else {
                      ares_llist_node_destroy(paVar14);
                    }
                    paVar14 = ares_llist_node_first(local_160->ips);
                  }
                }
                paVar14 = ares_llist_node_first(local_160->hosts);
                while (paVar14 != (ares_llist_node_t *)0x0) {
                  pcVar10 = (char *)ares_llist_node_val(paVar14);
                  pvVar16 = ares_htable_strvp_get_direct(local_150->hosthash,pcVar10);
                  if (pvVar16 == (void *)0x0) {
                    ares_llist_node_mvparent_last(paVar14,paVar15->hosts);
                  }
                  else {
                    ares_llist_node_destroy(paVar14);
                  }
                  paVar14 = ares_llist_node_first(local_160->hosts);
                }
                ares_hosts_entry_destroy(local_160);
                local_160 = paVar15;
              }
              paVar9 = local_150;
              if (iVar3 == 1) {
LAB_00111adf:
                paVar14 = ares_llist_node_last(local_160->hosts);
                aVar17 = ARES_SUCCESS;
                bVar1 = true;
                paVar9 = local_150;
                paVar2 = channel;
                if (paVar14 != (ares_llist_node_t *)0x0) {
                  do {
                    local_140 = paVar2;
                    pcVar10 = (char *)ares_llist_node_val(paVar14);
                    paVar9 = local_150;
                    if (local_148 == 0) {
                      cVar19 = '\x02';
                      local_148 = 0;
                    }
                    else {
                      local_148 = local_148 - 1;
                      aVar4 = ares_htable_strvp_get(local_150->hosthash,pcVar10,(void **)0x0);
                      cVar19 = '\x04';
                      channel = local_140;
                      if (aVar4 == ARES_FALSE) {
                        aVar4 = ares_htable_strvp_insert(paVar9->hosthash,pcVar10,local_160);
                        cVar19 = aVar4 == ARES_FALSE;
                        channel = local_140;
                      }
                    }
                    if ((cVar19 != '\0') && (cVar19 != '\x04')) {
                      bVar1 = true;
                      paVar9 = local_150;
                      if (cVar19 != '\x02') goto LAB_00111bbe;
                      goto LAB_00111bc5;
                    }
                    paVar14 = ares_llist_node_prev(paVar14);
                    paVar2 = local_140;
                  } while (paVar14 != (ares_llist_node_t *)0x0);
                  bVar1 = true;
                  paVar9 = local_150;
                }
              }
              else {
                pcVar10 = (char *)ares_llist_last_val(local_160->ips);
                aVar4 = ares_htable_strvp_get(paVar9->iphash,pcVar10,(void **)0x0);
                if (aVar4 != ARES_FALSE) goto LAB_00111adf;
                aVar4 = ares_htable_strvp_insert(paVar9->iphash,pcVar10,local_160);
                if (aVar4 != ARES_FALSE) {
                  local_160->refcnt = local_160->refcnt + 1;
                  goto LAB_00111adf;
                }
                ares_hosts_entry_destroy(local_160);
LAB_00111bbe:
                aVar17 = ARES_ENOMEM;
                bVar1 = false;
              }
LAB_00111bc5:
              local_160 = (ares_hosts_entry_t *)0x0;
              local_148 = local_148 & 0xffffffff00000000;
              uVar6 = 2;
              aVar5 = ARES_SUCCESS;
              if (!bVar1) goto LAB_001118ae;
            }
            else {
              if (aVar17 == ARES_ENOMEM) goto LAB_001118ab;
              ares_hosts_entry_destroy(local_160);
              local_160 = (ares_hosts_entry_t *)0x0;
              aVar5 = aVar17;
            }
          }
LAB_001115cf:
          aVar17 = aVar5;
          ares_buf_consume_line(buf,ARES_TRUE);
          uVar6 = (undefined4)local_148;
        }
LAB_001118ae:
        switch(uVar6) {
        case 0:
        case 3:
          goto switchD_001118c7_caseD_0;
        default:
          goto LAB_001114ec;
        case 2:
          goto switchD_001118c7_caseD_2;
        case 4:
          goto switchD_001118c7_caseD_4;
        }
      }
      local_160 = (ares_hosts_entry_t *)0x0;
      goto LAB_001114ca;
    }
  }
  local_160 = (ares_hosts_entry_t *)0x0;
  paVar9 = (ares_hosts_file_t *)0x0;
  goto LAB_001114ca;
joined_r0x00111751:
  if (paVar14 == (ares_llist_node_t *)0x0) {
    pcVar7 = ares_strdup((char *)&local_138);
    lVar18 = 1;
    if (pcVar7 != (char *)0x0) {
      paVar14 = ares_llist_insert_last(local_160->hosts,pcVar7);
      lVar18 = 0;
      if (paVar14 == (ares_llist_node_t *)0x0) {
        ares_free(pcVar7);
        lVar18 = 1;
      }
    }
LAB_001116a4:
    aVar17 = (*(code *)((long)&DAT_0012a1e0 + (long)(int)(&DAT_0012a1e0)[lVar18]))();
    return aVar17;
  }
  pcVar7 = (char *)ares_llist_node_val(paVar14);
  aVar4 = ares_strcaseeq(pcVar7,(char *)&local_138);
  if (aVar4 != ARES_FALSE) goto LAB_001116a4;
  paVar14 = ares_llist_node_next(paVar14);
  goto joined_r0x00111751;
switchD_001118c7_caseD_0:
  sVar12 = ares_buf_len(buf);
  if (sVar12 == 0) {
switchD_001118c7_caseD_4:
    aVar17 = ARES_SUCCESS;
    goto switchD_001118c7_caseD_2;
  }
  goto LAB_00111592;
switchD_001118c7_caseD_2:
LAB_001114ca:
  ares_hosts_entry_destroy(local_160);
  ares_buf_destroy(buf);
  if (aVar17 == ARES_SUCCESS) {
    channel->hf = paVar9;
  }
  else {
    ares_hosts_file_destroy(paVar9);
  }
LAB_001114ec:
  ares_free(pcVar7);
  return aVar17;
}

Assistant:

static ares_status_t ares_hosts_update(ares_channel_t *channel,
                                       ares_bool_t     use_env)
{
  ares_status_t status;
  char         *filename = NULL;

  status = ares_hosts_path(channel, use_env, &filename);
  if (status != ARES_SUCCESS) {
    return status;
  }

  if (!ares_hosts_expired(filename, channel->hf)) {
    ares_free(filename);
    return ARES_SUCCESS;
  }

  ares_hosts_file_destroy(channel->hf);
  channel->hf = NULL;

  status = ares_parse_hosts(filename, &channel->hf);
  ares_free(filename);
  return status;
}